

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall google::protobuf::SourceCodeInfo::SourceCodeInfo(SourceCodeInfo *this)

{
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__SourceCodeInfo_0047e0b0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  this->_has_bits_ = (uint32  [1])0x0;
  this->_cached_size_ = (atomic<int>)0x0;
  (this->location_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->location_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->location_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->location_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  internal::InitSCC(&scc_info_SourceCodeInfo_google_2fprotobuf_2fdescriptor_2eproto.base);
  return;
}

Assistant:

SourceCodeInfo::SourceCodeInfo()
  : ::PROTOBUF_NAMESPACE_ID::Message(), _internal_metadata_(nullptr) {
  SharedCtor();
  // @@protoc_insertion_point(constructor:google.protobuf.SourceCodeInfo)
}